

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_utils.cpp
# Opt level: O0

string * jsonnet::internal::path_dir_with_trailing_separator(string *path)

{
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  size_t last_slash;
  allocator<char> local_19;
  long local_18;
  string *__s;
  
  __s = in_RDI;
  local_18 = std::__cxx11::string::find_last_of((char *)in_RSI,0x3590eb);
  if (local_18 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,in_RSI);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string path_dir_with_trailing_separator(const std::string &path) {
    size_t last_slash = path.find_last_of(DIR_SEPARATORS);
    if (last_slash != std::string::npos) {
        return path.substr(0, last_slash + 1);
    }
    return "";
}